

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_AigDfs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_24;
  Abc_Obj_t *pAStack_20;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    iVar1 = Abc_ObjIsCi(pNode);
    if ((iVar1 == 0) && (iVar1 = Abc_AigNodeIsConst(pNode), iVar1 == 0)) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode( pNode )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x496,"void Abc_AigDfs_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pNode_00 = Abc_ObjFanin(pNode,local_24);
        Abc_AigDfs_rec(pNode_00,vNodes);
      }
      iVar1 = Abc_AigNodeIsChoice(pNode);
      if (iVar1 != 0) {
        for (pAStack_20 = (Abc_Obj_t *)(pNode->field_5).pData; pAStack_20 != (Abc_Obj_t *)0x0;
            pAStack_20 = (Abc_Obj_t *)(pAStack_20->field_5).pData) {
          Abc_AigDfs_rec(pAStack_20,vNodes);
        }
      }
      Vec_PtrPush(vNodes,pNode);
    }
  }
  return;
}

Assistant:

void Abc_AigDfs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the PI
    if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_AigDfs_rec( pFanin, vNodes );
    // visit the equivalent nodes
    if ( Abc_AigNodeIsChoice( pNode ) )
        for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
            Abc_AigDfs_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}